

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_terminal_attr<tinyusdz::value::matrix4d>
                   (string *__return_storage_ptr__,
                   TypedTerminalAttribute<tinyusdz::value::matrix4d> *attr,string *name,
                   uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  ostream *poVar4;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  stringstream ss;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  indent_00 = indent;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (attr->_authored == true) {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)(ulong)indent,n);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    sVar2 = (attr->_actual_type_name)._M_string_length;
    if (sVar2 == 0) {
      paVar1 = &local_1f8.field_2;
      local_1f8.field_2._M_allocated_capacity = 0x643478697274616d;
      local_1f8._M_string_length = 8;
      local_1f8.field_2._M_local_buf[8] = '\0';
      local_1f8._M_dataplus._M_p = (pointer)paVar1;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(attr->_actual_type_name)._M_dataplus._M_p,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
    }
    bVar3 = AttrMetas::authored(&attr->_metas);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      print_attr_metas_abi_cxx11_
                (&local_1f8,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_terminal_attr(const TypedTerminalAttribute<T> &attr,
                                      const std::string &name,
                                      const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {
    ss << pprint::Indent(indent);

    if (attr.has_actual_type()) {
      ss << attr.get_actual_type_name() << " " << name;
    } else {
      ss << value::TypeTraits<T>::type_name() << " " << name;
    }

    if (attr.metas().authored()) {
      ss << " (\n"
         << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
         << ")";
    }
    ss << "\n";
  }

  return ss.str();
}